

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjPrintEqn(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  int c;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vSuper_00;
  char *pcVar3;
  int local_40;
  int i;
  int fCompl;
  Aig_Obj_t *pFanin;
  Vec_Ptr_t *vSuper;
  int Level_local;
  Vec_Vec_t *vLevels_local;
  Aig_Obj_t *pObj_local;
  FILE *pFile_local;
  
  c = Aig_IsComplement(pObj);
  pAVar2 = Aig_Regular(pObj);
  iVar1 = Aig_ObjIsConst1(pAVar2);
  if (iVar1 == 0) {
    iVar1 = Aig_ObjIsCi(pAVar2);
    if (iVar1 == 0) {
      Vec_VecExpand(vLevels,Level);
      vSuper_00 = Vec_VecEntry(vLevels,Level);
      Aig_ObjCollectMulti(pAVar2,vSuper_00);
      pcVar3 = "(";
      if (Level == 0) {
        pcVar3 = "";
      }
      fprintf((FILE *)pFile,"%s",pcVar3);
      for (local_40 = 0; iVar1 = Vec_PtrSize(vSuper_00), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper_00,local_40);
        pAVar2 = Aig_NotCond(pAVar2,c);
        Aig_ObjPrintEqn(pFile,pAVar2,vLevels,Level + 1);
        iVar1 = Vec_PtrSize(vSuper_00);
        if (local_40 < iVar1 + -1) {
          pcVar3 = "*";
          if (c != 0) {
            pcVar3 = "+";
          }
          fprintf((FILE *)pFile," %s ",pcVar3);
        }
      }
      pcVar3 = ")";
      if (Level == 0) {
        pcVar3 = "";
      }
      fprintf((FILE *)pFile,"%s",pcVar3);
    }
    else {
      pcVar3 = "";
      if (c != 0) {
        pcVar3 = "!";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar3,(pAVar2->field_5).pData);
    }
  }
  else {
    fprintf((FILE *)pFile,"%d",(ulong)((c != 0 ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void Aig_ObjPrintEqn( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "!" : "", (char*)pObj->pData );
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintEqn( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "+" : "*" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}